

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesBufferSparseResidency.cpp
# Opt level: O1

void __thiscall
vkt::sparse::anon_unknown_0::BufferSparseResidencyCase::initPrograms
          (BufferSparseResidencyCase *this,SourceCollections *sourceCollections)

{
  char *__s;
  size_t sVar1;
  ostream *poVar2;
  ProgramSources *pPVar3;
  ostringstream src;
  undefined1 auStack_208 [8];
  long *local_200;
  long local_1f8;
  long local_1f0 [2];
  string local_1e0;
  uint local_1c0;
  value_type local_1b8;
  long local_198 [14];
  ios_base local_128 [264];
  
  __s = glu::getGLSLVersionDeclaration(this->m_glslVersion);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  if (__s == (char *)0x0) {
    std::ios::clear((int)auStack_208 + (int)*(undefined8 *)(local_198[0] + -0x18) + 0x70);
  }
  else {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,__s,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,
             "layout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n",0x42);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"layout(set = 0, binding = 0, std430) readonly buffer Input\n",
             0x3b);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"\tuint data[];\n",0xe);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"} sb_in;\n",9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"layout(set = 0, binding = 1, std430) writeonly buffer Output\n",
             0x3d);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"\tuint result[];\n",0x10)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"} sb_out;\n",10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"void main (void)\n",0x11)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"\tfor(int i=0; i<",0x10);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_198);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"; ++i) \n",8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\t{\n",3);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"\t\tsb_out.result[i] = sb_in.data[i];",0x23);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\t}\n",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"}\n",2);
  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"comp","");
  pPVar3 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&sourceCollections->glslSources,&local_1e0);
  std::__cxx11::stringbuf::str();
  local_1c0 = 5;
  local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1b8,local_200,local_1f8 + (long)local_200);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pPVar3->sources + local_1c0,&local_1b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  if (local_200 != local_1f0) {
    operator_delete(local_200,local_1f0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  std::ios_base::~ios_base(local_128);
  return;
}

Assistant:

void BufferSparseResidencyCase::initPrograms (SourceCollections& sourceCollections) const
{
	const char* const	versionDecl		= glu::getGLSLVersionDeclaration(m_glslVersion);
	const deUint32		iterationsCount = m_bufferSize / SIZE_OF_UINT_IN_SHADER;

	std::ostringstream src;

	src << versionDecl << "\n"
		<< "layout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n"
		<< "layout(set = 0, binding = 0, std430) readonly buffer Input\n"
		<< "{\n"
		<< "	uint data[];\n"
		<< "} sb_in;\n"
		<< "\n"
		<< "layout(set = 0, binding = 1, std430) writeonly buffer Output\n"
		<< "{\n"
		<< "	uint result[];\n"
		<< "} sb_out;\n"
		<< "\n"
		<< "void main (void)\n"
		<< "{\n"
		<< "	for(int i=0; i<" << iterationsCount << "; ++i) \n"
		<< "	{\n"
		<< "		sb_out.result[i] = sb_in.data[i];"
		<< "	}\n"
		<< "}\n";

	sourceCollections.glslSources.add("comp") << glu::ComputeSource(src.str());
}